

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValueArray<const_char_*,_const_char_*>::
make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
make_array(make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,_MyTuple *t)

{
  string *local_30;
  _MyTuple *t_local;
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_30 = (string *)this;
  do {
    std::__cxx11::string::string(local_30);
    local_30 = local_30 + 0x20;
  } while (local_30 != (string *)(this + 1));
  tuples::
  tuple_foreach<std::tuple<char_const*,char_const*>const,iutest::detail::iuValueArray<char_const*,char_const*>::make_array<std::__cxx11::string>>
            (t,this);
  return;
}

Assistant:

explicit make_array(const _MyTuple& t)
        {
            tuples::tuple_foreach(t, *this);
        }